

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupFlopsOnly(Aig_Man_t *p)

{
  Aig_Man_t *p_00;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar1;
  int iVar2;
  
  p_00 = Aig_ManDupWithoutPos(p);
  for (iVar2 = 0; iVar2 < p->nRegs; iVar2 = iVar2 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,p->nTruePos + iVar2);
    pAVar1 = Aig_ObjChild0Copy(pObj);
    pAVar1 = Aig_ObjCreateCo(p_00,pAVar1);
    (pObj->field_5).pData = pAVar1;
  }
  Aig_ManCleanup(p_00);
  Aig_ManSetRegNum(p_00,p->nRegs);
  iVar2 = Aig_ManCheck(p_00);
  if (iVar2 == 0) {
    puts("Aig_ManDupFlopsOnly(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupFlopsOnly( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    pNew = Aig_ManDupWithoutPos( p );
    Saig_ManForEachLi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupFlopsOnly(): The check has failed.\n" );
    return pNew;

}